

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cpp
# Opt level: O1

bool __thiscall Gluco::SimpSolver::backwardSubsumptionCheck(SimpSolver *this,bool verbose)

{
  Clause *this_00;
  uint uVar1;
  vec<unsigned_int> *pvVar2;
  uint *puVar3;
  ulong uVar4;
  uint uVar5;
  OccLists<int,_Gluco::vec<unsigned_int>,_Gluco::SimpSolver::ClauseDeleted> *pOVar6;
  bool bVar7;
  int iVar8;
  Lit LVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  undefined7 in_register_00000031;
  vec<unsigned_int> *pvVar15;
  uint *puVar16;
  Queue<unsigned_int> *this_01;
  Var best;
  int local_6c;
  uint *local_68;
  uint local_5c;
  uint local_58;
  int local_54;
  vec<unsigned_int> *local_50;
  undefined4 local_44;
  Queue<unsigned_int> *local_40;
  OccLists<int,_Gluco::vec<unsigned_int>,_Gluco::SimpSolver::ClauseDeleted> *local_38;
  int iVar9;
  
  local_44 = (undefined4)CONCAT71(in_register_00000031,verbose);
  if ((this->super_Solver).trail_lim.sz != 0) {
    __assert_fail("decisionLevel() == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/glucose/SimpSolver.cpp"
                  ,0x163,"bool Gluco::SimpSolver::backwardSubsumptionCheck(bool)");
  }
  this_01 = &this->subsumption_queue;
  local_38 = &this->occurs;
  local_58 = 0;
  local_5c = 0;
  local_54 = 0;
  local_40 = this_01;
  while( true ) {
    iVar8 = (this->subsumption_queue).end;
    iVar9 = 0;
    iVar13 = (this->subsumption_queue).first;
    iVar12 = iVar8 - iVar13;
    if (iVar8 < iVar13) {
      iVar9 = (this->subsumption_queue).buf.sz;
    }
    iVar8 = iVar9 + iVar12;
    if ((iVar8 == 0 || SCARRY4(iVar9,iVar12) != iVar8 < 0) &&
       ((this->super_Solver).trail.sz <= this->bwdsub_assigns)) {
      return true;
    }
    if ((this->super_Solver).asynch_interrupt == true) {
      if ((this_01->buf).data != (uint *)0x0) {
        (this->subsumption_queue).buf.sz = 0;
      }
      vec<unsigned_int>::growTo(&this_01->buf,1);
      (this->subsumption_queue).first = 0;
      (this->subsumption_queue).end = 0;
      this->bwdsub_assigns = (this->super_Solver).trail.sz;
      return true;
    }
    if (iVar8 == 0) {
      iVar8 = this->bwdsub_assigns;
      if (iVar8 < (this->super_Solver).trail.sz) {
        this->bwdsub_assigns = iVar8 + 1;
        if ((this->super_Solver).ca.super_RegionAllocator<unsigned_int>.sz <= this->bwdsub_tmpunit)
        break;
        puVar16 = (this->super_Solver).ca.super_RegionAllocator<unsigned_int>.memory;
        puVar16[(ulong)this->bwdsub_tmpunit + 3] = (this->super_Solver).trail.data[iVar8].x;
        if ((this->super_Solver).ca.super_RegionAllocator<unsigned_int>.sz <= this->bwdsub_tmpunit)
        break;
        Clause::calcAbstraction((Clause *)(puVar16 + this->bwdsub_tmpunit));
        Queue<unsigned_int>::insert(this_01,this->bwdsub_tmpunit);
      }
    }
    iVar8 = (this->subsumption_queue).first;
    if (iVar8 == (this->subsumption_queue).end) {
      __assert_fail("first != end",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/glucose/Queue.h"
                    ,0x31,"T Gluco::Queue<unsigned int>::peek() const [T = unsigned int]");
    }
    uVar1 = (this->subsumption_queue).buf.data[iVar8];
    Queue<unsigned_int>::pop(this_01);
    if ((this->super_Solver).ca.super_RegionAllocator<unsigned_int>.sz <= uVar1) break;
    puVar16 = (this->super_Solver).ca.super_RegionAllocator<unsigned_int>.memory;
    bVar7 = false;
    if ((puVar16[uVar1] & 3) == 0) {
      if ((((char)local_44 != '\0') && (1 < (this->super_Solver).verbosity)) &&
         (iVar8 = local_54 * 0x26e978d5, iVar13 = local_54 + 1, uVar5 = local_54 * -0x60000000,
         local_54 = iVar13, (iVar8 + 0x10624d8U >> 3 | uVar5) < 0x418937)) {
        iVar8 = (this->subsumption_queue).end;
        iVar9 = 0;
        iVar13 = (this->subsumption_queue).first;
        if (iVar8 < iVar13) {
          iVar9 = (this->subsumption_queue).buf.sz;
        }
        printf("subsumption left: %10d (%10d subsumed, %10d deleted literals)\r",
               (ulong)(uint)((iVar8 - iVar13) + iVar9),(ulong)local_5c,(ulong)local_58);
      }
      pOVar6 = local_38;
      this_00 = (Clause *)(puVar16 + uVar1);
      if ((*(int *)&(this_00->header).field_0x4 < 2) &&
         ((this->super_Solver).assigns.data[*(int *)&this_00[1].header >> 1].value !=
          ((byte)*(int *)&this_00[1].header & 1))) {
        __assert_fail("c.size() > 1 || value(c[0]) == l_True",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/glucose/SimpSolver.cpp"
                      ,0x17c,"bool Gluco::SimpSolver::backwardSubsumptionCheck(bool)");
      }
      iVar8 = *(int *)&this_00[1].header >> 1;
      local_6c = iVar8;
      if (1 < *(int *)&(this_00->header).field_0x4) {
        pvVar2 = (this->occurs).occs.data;
        lVar11 = 4;
        do {
          iVar13 = *(int *)(&(this_00->header).field_0x0 + lVar11 * 4) >> 1;
          if (pvVar2[iVar13].sz < pvVar2[iVar8].sz) {
            iVar8 = iVar13;
            local_6c = iVar13;
          }
          lVar14 = lVar11 + -2;
          lVar11 = lVar11 + 1;
        } while (lVar14 < *(int *)&(this_00->header).field_0x4);
      }
      if ((this->occurs).dirty.data[local_6c] != '\0') {
        OccLists<int,_Gluco::vec<unsigned_int>,_Gluco::SimpSolver::ClauseDeleted>::clean
                  (local_38,&local_6c);
      }
      lVar11 = (long)local_6c;
      pvVar2 = (pOVar6->occs).data;
      if (0 < pvVar2[lVar11].sz) {
        pvVar15 = pvVar2 + lVar11;
        puVar16 = pvVar2[lVar11].data;
        iVar8 = 0;
        local_68 = puVar16;
        local_50 = pvVar15;
        do {
          if ((undefined1  [12])((undefined1  [12])this_00->header & (undefined1  [12])0x3) !=
              (undefined1  [12])0x0) break;
          uVar5 = puVar16[iVar8];
          if ((this->super_Solver).ca.super_RegionAllocator<unsigned_int>.sz <= uVar5)
          goto LAB_005be8c9;
          puVar3 = (this->super_Solver).ca.super_RegionAllocator<unsigned_int>.memory;
          uVar4 = *(ulong *)(puVar3 + uVar5);
          if ((((uVar4 & 3) == 0) && (uVar5 != uVar1)) &&
             ((this->subsumption_lim == -1 || ((int)(uVar4 >> 0x20) < this->subsumption_lim)))) {
            LVar10 = Clause::subsumes(this_00,(Clause *)(puVar3 + uVar5));
            puVar16 = local_68;
            bVar7 = true;
            if (LVar10.x != -1) {
              if (LVar10.x == -2) {
                local_5c = local_5c + 1;
                removeClause(this,local_68[iVar8]);
              }
              else {
                local_58 = local_58 + 1;
                bVar7 = strengthenClause(this,local_68[iVar8],(Lit)(LVar10.x ^ 1));
                puVar16 = local_68;
                if (!bVar7) {
                  bVar7 = false;
                  goto LAB_005be857;
                }
                iVar8 = iVar8 - (uint)(LVar10.x >> 1 == local_6c);
              }
              bVar7 = true;
            }
LAB_005be857:
            pvVar15 = local_50;
            if (!bVar7) {
              bVar7 = true;
              this_01 = local_40;
              goto LAB_005be86f;
            }
          }
          iVar8 = iVar8 + 1;
        } while (iVar8 < pvVar15->sz);
      }
      bVar7 = false;
      this_01 = local_40;
    }
LAB_005be86f:
    if (bVar7) {
      return false;
    }
  }
LAB_005be8c9:
  __assert_fail("r >= 0 && r < sz",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/glucose/Alloc.h"
                ,0x42,"T &Gluco::RegionAllocator<unsigned int>::operator[](Ref) [T = unsigned int]")
  ;
}

Assistant:

bool SimpSolver::backwardSubsumptionCheck(bool verbose)
{
    int cnt = 0;
    int subsumed = 0;
    int deleted_literals = 0;
    assert(decisionLevel() == 0);

    while (subsumption_queue.size() > 0 || bwdsub_assigns < trail.size()){

        // Empty subsumption queue and return immediately on user-interrupt:
        if (asynch_interrupt){
            subsumption_queue.clear();
            bwdsub_assigns = trail.size();
            break; }

        // Check top-level assignments by creating a dummy clause and placing it in the queue:
        if (subsumption_queue.size() == 0 && bwdsub_assigns < trail.size()){
            Lit l = trail[bwdsub_assigns++];
            ca[bwdsub_tmpunit][0] = l;
            ca[bwdsub_tmpunit].calcAbstraction();
            subsumption_queue.insert(bwdsub_tmpunit); }

        CRef    cr = subsumption_queue.peek(); subsumption_queue.pop();
        Clause& c  = ca[cr];

        if (c.mark()) continue;

        if (verbose && verbosity >= 2 && cnt++ % 1000 == 0)
            printf("subsumption left: %10d (%10d subsumed, %10d deleted literals)\r", subsumption_queue.size(), subsumed, deleted_literals);

        assert(c.size() > 1 || value(c[0]) == l_True);    // Unit-clauses should have been propagated before this point.

        // Find best variable to scan:
        Var best = var(c[0]);
        for (int i = 1; i < c.size(); i++)
            if (occurs[var(c[i])].size() < occurs[best].size())
                best = var(c[i]);

        // Search all candidates:
        vec<CRef>& _cs = occurs.lookup(best);
        CRef*       cs = (CRef*)_cs;

        for (int j = 0; j < _cs.size(); j++)
            if (c.mark())
                break;
            else if (!ca[cs[j]].mark() &&  cs[j] != cr && (subsumption_lim == -1 || ca[cs[j]].size() < subsumption_lim)){
                Lit l = c.subsumes(ca[cs[j]]);

                if (l == lit_Undef)
                    subsumed++, removeClause(cs[j]);
                else if (l != lit_Error){
                    deleted_literals++;

                    if (!strengthenClause(cs[j], ~l))
                        return false;

                    // Did current candidate get deleted from cs? Then check candidate at index j again:
                    if (var(l) == best)
                        j--;
                }
            }
    }

    return true;
}